

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O3

void __thiscall
btStaticPlaneShape::processAllTriangles
          (btStaticPlaneShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  fVar7 = (float)*(undefined8 *)aabbMin->m_floats;
  fVar3 = (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
  fVar1 = (this->m_planeNormal).m_floats[2];
  if (ABS(fVar1) <= 0.70710677) {
    uVar8 = *(undefined8 *)(this->m_planeNormal).m_floats;
    fVar16 = (float)uVar8;
    fVar4 = (float)((ulong)uVar8 >> 0x20);
    fVar18 = fVar16 * fVar16 + fVar4 * fVar4;
    fVar17 = 1.0 / SQRT(fVar18);
    fVar18 = fVar18 * fVar17;
    fVar16 = fVar17 * fVar16;
    fVar6 = fVar17 * -fVar4;
    fVar17 = fVar17 * 0.0;
    fVar10 = -fVar1 * fVar16;
    fVar11 = fVar1 * fVar6;
    fVar13 = fVar17 * -0.0;
    fVar5 = 0.0;
  }
  else {
    uVar8 = *(undefined8 *)(this->m_planeNormal).m_floats;
    fVar4 = (float)((ulong)uVar8 >> 0x20);
    fVar17 = fVar4 * fVar4 + fVar1 * fVar1;
    fVar10 = 1.0 / SQRT(fVar17);
    fVar16 = -fVar1 * fVar10;
    fVar5 = fVar4 * fVar10;
    fVar10 = fVar10 * fVar17;
    fVar11 = fVar5 * -(float)uVar8;
    fVar13 = fVar4 * 0.0;
    fVar18 = (float)uVar8 * fVar16;
    fVar6 = 0.0;
    fVar17 = 0.0;
  }
  fVar14 = (float)*(undefined8 *)aabbMax->m_floats;
  fVar12 = (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
  fVar20 = (fVar14 + fVar7) * 0.5;
  fVar21 = (fVar12 + fVar3) * 0.5;
  fVar19 = (aabbMax->m_floats[2] + aabbMin->m_floats[2]) * 0.5;
  fVar9 = (float)((ulong)uVar8 >> 0x20);
  fVar15 = (fVar1 * fVar19 + (float)uVar8 * fVar20 + fVar21 * fVar9) - this->m_planeConstant;
  fVar2 = (aabbMax->m_floats[2] - aabbMin->m_floats[2]) * 0.5;
  fVar14 = (fVar14 - fVar7) * 0.5;
  fVar7 = (fVar12 - fVar3) * 0.5;
  fVar3 = SQRT(fVar2 * fVar2 + fVar14 * fVar14 + fVar7 * fVar7);
  fVar18 = fVar18 * fVar3;
  uVar22 = CONCAT44(fVar4,fVar18);
  fVar19 = fVar19 - fVar1 * fVar15;
  fVar20 = fVar20 - fVar15 * (float)uVar8;
  fVar21 = fVar21 - fVar15 * fVar9;
  fVar1 = fVar6 * fVar3 + fVar20;
  fVar7 = fVar16 * fVar3 + fVar21;
  fVar4 = fVar5 * fVar3 + fVar19;
  fVar10 = fVar3 * fVar10;
  fVar11 = fVar3 * fVar11;
  fVar14 = fVar10 + fVar1;
  fVar12 = fVar11 + fVar7;
  fVar2 = fVar18 + fVar4;
  auVar25._4_4_ = fVar12;
  auVar25._0_4_ = fVar14;
  auVar25._8_4_ = fVar2;
  auVar25._12_4_ = 0;
  local_48._4_4_ = fVar12;
  local_48._0_4_ = fVar14;
  local_48._8_4_ = fVar2;
  local_48._12_4_ = 0;
  local_38._4_4_ = fVar7 - fVar11;
  local_38._0_4_ = fVar1 - fVar10;
  local_38._8_4_ = fVar4 - fVar18;
  local_38._12_4_ = 0;
  fVar19 = fVar19 - fVar5 * fVar3;
  auVar24 = ZEXT416((uint)fVar19);
  fVar20 = fVar20 - fVar6 * fVar3;
  fVar21 = fVar21 - fVar16 * fVar3;
  fVar1 = fVar21 - fVar11;
  fVar19 = fVar19 - fVar18;
  auVar23._4_4_ = fVar1;
  auVar23._0_4_ = fVar20 - fVar10;
  auVar23._8_4_ = fVar19;
  auVar23._12_4_ = 0;
  local_28._4_4_ = fVar1;
  local_28._0_4_ = fVar20 - fVar10;
  local_28._8_4_ = fVar19;
  local_28._12_4_ = 0;
  (*callback->_vptr_btTriangleCallback[2])
            (callback,local_48,0,0,in_R8,in_R9,uVar22,0,auVar23,fVar10,fVar3 * fVar13,auVar24,fVar20
             ,(0.0 - fVar15 * 0.0) - fVar17 * fVar3,auVar25);
  local_38._4_4_ = fVar21 + fVar11;
  local_38._0_4_ = fVar20 + fVar10;
  local_38._8_4_ = auVar24._0_4_ + (float)uVar22;
  local_38._12_4_ = 0;
  local_48 = auVar23;
  local_28 = auVar25;
  (*callback->_vptr_btTriangleCallback[2])(callback,local_48,0,1);
  return;
}

Assistant:

void	btStaticPlaneShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{

	btVector3 halfExtents = (aabbMax - aabbMin) * btScalar(0.5);
	btScalar radius = halfExtents.length();
	btVector3 center = (aabbMax + aabbMin) * btScalar(0.5);
	
	//this is where the triangles are generated, given AABB and plane equation (normal/constant)

	btVector3 tangentDir0,tangentDir1;

	//tangentDir0/tangentDir1 can be precalculated
	btPlaneSpace1(m_planeNormal,tangentDir0,tangentDir1);

	btVector3 supVertex0,supVertex1;

	btVector3 projectedCenter = center - (m_planeNormal.dot(center) - m_planeConstant)*m_planeNormal;
	
	btVector3 triangle[3];
	triangle[0] = projectedCenter + tangentDir0*radius + tangentDir1*radius;
	triangle[1] = projectedCenter + tangentDir0*radius - tangentDir1*radius;
	triangle[2] = projectedCenter - tangentDir0*radius - tangentDir1*radius;

	callback->processTriangle(triangle,0,0);

	triangle[0] = projectedCenter - tangentDir0*radius - tangentDir1*radius;
	triangle[1] = projectedCenter - tangentDir0*radius + tangentDir1*radius;
	triangle[2] = projectedCenter + tangentDir0*radius + tangentDir1*radius;

	callback->processTriangle(triangle,0,1);

}